

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_shared_secret(uint8_t *public_key,uint8_t *private_key,uint8_t *secret,uECC_Curve curve)

{
  char num_words_00;
  char cVar1;
  int iVar2;
  uECC_word_t uVar3;
  wordcount_t num_bytes;
  wordcount_t num_words;
  uECC_word_t carry;
  uECC_word_t *initial_Z;
  uECC_word_t *p2 [2];
  uECC_word_t tmp [4];
  uECC_word_t _private [4];
  uECC_word_t _public [8];
  uECC_Curve curve_local;
  uint8_t *secret_local;
  uint8_t *private_key_local;
  uint8_t *public_key_local;
  
  p2[0] = (uECC_word_t *)(p2 + 1);
  carry = 0;
  num_words_00 = curve->num_words;
  cVar1 = curve->num_bytes;
  uECC_vli_bytesToNative(tmp + 3,private_key,(curve->num_n_bits + 7) / 8);
  uECC_vli_bytesToNative(_private + 3,public_key,(int)cVar1);
  uECC_vli_bytesToNative(_private + (long)(int)num_words_00 + 3,public_key + (int)cVar1,(int)cVar1);
  uVar3 = regularize_k(tmp + 3,tmp + 3,(uECC_word_t *)(p2 + 1),curve);
  if (g_rng_function != (uECC_RNG_Function)0x0) {
    iVar2 = uECC_generate_random_int(p2[uVar3 - 1],curve->p,num_words_00);
    if (iVar2 == 0) {
      return 0;
    }
    carry = (uECC_word_t)p2[uVar3 - 1];
  }
  EccPoint_mult(_private + 3,_private + 3,p2[(long)(int)(uint)((uVar3 != 0 ^ 0xffU) & 1) + -1],
                (uECC_word_t *)carry,curve->num_n_bits + 1,curve);
  uECC_vli_nativeToBytes(secret,(int)cVar1,_private + 3);
  uVar3 = uECC_vli_isZero(_private + 3,curve->num_words << 1);
  return (uint)((uVar3 != 0 ^ 0xffU) & 1);
}

Assistant:

int uECC_shared_secret(const uint8_t *public_key,
                       const uint8_t *private_key,
                       uint8_t *secret,
                       uECC_Curve curve) {
    uECC_word_t _public[uECC_MAX_WORDS * 2];
    uECC_word_t _private[uECC_MAX_WORDS];

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {_private, tmp};
    uECC_word_t *initial_Z = 0;
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_bytes = curve->num_bytes;

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) _private, private_key, num_bytes);
    bcopy((uint8_t *) _public, public_key, num_bytes*2);
#else
    uECC_vli_bytesToNative(_private, private_key, BITS_TO_BYTES(curve->num_n_bits));
    uECC_vli_bytesToNative(_public, public_key, num_bytes);
    uECC_vli_bytesToNative(_public + num_words, public_key + num_bytes, num_bytes);
#endif

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(_private, _private, tmp, curve);

    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(p2[carry], curve->p, num_words)) {
            return 0;
        }
        initial_Z = p2[carry];
    }

    EccPoint_mult(_public, _public, p2[!carry], initial_Z, curve->num_n_bits + 1, curve);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) secret, (uint8_t *) _public, num_bytes);
#else
    uECC_vli_nativeToBytes(secret, num_bytes, _public);
#endif
    return !EccPoint_isZero(_public, curve);
}